

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O1

Derivatives * __thiscall
Harris::ApplyGaussToDerivatives
          (Derivatives *__return_storage_ptr__,Harris *this,Derivatives *dMats,int filterRange)

{
  Mat *this_00;
  int range;
  Mat *img;
  Mat *img_00;
  Harris HStack_88;
  
  img = &HStack_88.harrisResponses;
  img_00 = &HStack_88.harrisResponses;
  this_00 = &__return_storage_ptr__->Iy;
  if (filterRange == 0) {
    cv::Mat::Mat(&__return_storage_ptr__->Ix,&dMats->Ix);
    cv::Mat::Mat(this_00,&dMats->Iy);
    cv::Mat::Mat(&__return_storage_ptr__->Ixy,&dMats->Ixy);
  }
  else {
    cv::Mat::Mat(&__return_storage_ptr__->Ix);
    cv::Mat::Mat(this_00);
    cv::Mat::Mat(&__return_storage_ptr__->Ixy);
    range = (int)dMats;
    GaussFilter(&HStack_88,&this->harrisResponses,range);
    cv::Mat::operator=(&__return_storage_ptr__->Ix,&HStack_88.harrisResponses);
    cv::Mat::~Mat(&HStack_88.harrisResponses);
    GaussFilter(&HStack_88,img,range + 0x60);
    cv::Mat::operator=(this_00,&HStack_88.harrisResponses);
    cv::Mat::~Mat(&HStack_88.harrisResponses);
    GaussFilter(&HStack_88,img_00,range + 0xc0);
    cv::Mat::operator=(&__return_storage_ptr__->Ixy,&HStack_88.harrisResponses);
    cv::Mat::~Mat(&HStack_88.harrisResponses);
  }
  return __return_storage_ptr__;
}

Assistant:

Derivatives Harris::ApplyGaussToDerivatives(Derivatives& dMats, int filterRange) {
    if(filterRange == 0)
        return dMats;

    Derivatives mdMats;

    mdMats.Ix = GaussFilter(dMats.Ix, filterRange);
    mdMats.Iy = GaussFilter(dMats.Iy, filterRange);
    mdMats.Ixy = GaussFilter(dMats.Ixy, filterRange);

    return mdMats;
}